

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

basic_message<wchar_t> * booster::locale::ngettext<wchar_t>(wchar_t *s,wchar_t *p,int n,locale *loc)

{
  basic_message<wchar_t> *in_RDI;
  int in_stack_ffffffffffffff2c;
  basic_message<wchar_t> *this;
  basic_message<wchar_t> local_a8;
  
  this = in_RDI;
  basic_message<wchar_t>::basic_message(&local_a8,&in_RDI->n_,&in_RDI->n_,in_stack_ffffffffffffff2c)
  ;
  basic_message<wchar_t>::str_abi_cxx11_(this,(locale *)in_RDI);
  basic_message<wchar_t>::~basic_message(in_RDI);
  return in_RDI;
}

Assistant:

std::basic_string<CharType> ngettext(   CharType const *s,
                                                CharType const *p,
                                                int n,
                                                std::locale const &loc=std::locale())
        {
            return basic_message<CharType>(s,p,n).str(loc);
        }